

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O2

void __thiscall
jaegertracing::propagation::
Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>::
~Propagator(Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>
            *this)

{
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  ::~Propagator((Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
                 *)(this + -8));
  return;
}

Assistant:

SpanContext extract(const Reader& reader) const override
    {
        SpanContext ctx;
        StrMap baggage;
        std::string debugID;
        const auto result = reader.ForeachKey(
            [this, &ctx, &debugID, &baggage](const std::string& rawKey,
                                             const std::string& value) {
                const auto key = normalizeKey(rawKey);
                if (key == _headerKeys.traceContextHeaderName()) {
                    const auto safeValue = decodeValue(value);
                    std::istringstream iss(safeValue);
                    if (!(iss >> ctx) || ctx == SpanContext()) {
                        return opentracing::make_expected_from_error<void>(
                            opentracing::span_context_corrupted_error);
                    }
                }
                else if (key == _headerKeys.jaegerDebugHeader()) {
                    debugID = value;
                }
                else if (key == _headerKeys.jaegerBaggageHeader()) {
                    for (auto&& pair : parseCommaSeparatedMap(value)) {
                        baggage[pair.first] = pair.second;
                    }
                }
                else {
                    const auto prefix = _headerKeys.traceBaggageHeaderPrefix();
                    if (key.size() >= prefix.size() &&
                        key.substr(0, prefix.size()) == prefix) {
                        const auto safeKey = removeBaggageKeyPrefix(key);
                        const auto safeValue = decodeValue(value);
                        baggage[safeKey] = safeValue;
                    }
                }
                return opentracing::make_expected();
            });

        if (!result &&
            result.error() == opentracing::span_context_corrupted_error) {
            _metrics->decodingErrors().inc(1);
            return SpanContext();
        }

        if (!ctx.traceID().isValid() && debugID.empty() && baggage.empty()) {
            return SpanContext();
        }

        int flags = ctx.flags();
        if (!debugID.empty()) {
            flags |= static_cast<unsigned char>(SpanContext::Flag::kDebug) |
                     static_cast<unsigned char>(SpanContext::Flag::kSampled);
        }
        return SpanContext(ctx.traceID(),
                           ctx.spanID(),
                           ctx.parentID(),
                           flags,
                           baggage,
                           debugID);
    }